

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  bool bVar1;
  uint64_t d64;
  char *pcVar2;
  FastDtoaMode mode_00;
  double_conversion *this;
  double v_00;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> vector;
  
  Vector<char>::Vector(&vector,buffer,buffer_length);
  if ((~(ulong)v & 0x7ff0000000000000) == 0) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x16e,
                  "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
                 );
  }
  if (requested_digits < 0 && SHORTEST_SINGLE < mode) {
    __assert_fail("mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x16f,
                  "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
                 );
  }
  *sign = SUB81((ulong)v >> 0x3f,0);
  if (mode == PRECISION && requested_digits == 0) {
    pcVar2 = Vector<char>::operator[](&vector,0);
    *pcVar2 = '\0';
    *length = 0;
    return;
  }
  if ((v == 0.0) && (!NAN(v))) {
    pcVar2 = Vector<char>::operator[](&vector,0);
    *pcVar2 = '0';
    pcVar2 = Vector<char>::operator[](&vector,1);
    *pcVar2 = '\0';
    *length = 1;
    *point = 1;
    return;
  }
  if (PRECISION < mode) {
    abort();
  }
  v_00 = ABS(v);
  switch(mode) {
  case SHORTEST:
    this = (double_conversion *)0x0;
    break;
  case SHORTEST_SINGLE:
    this = (double_conversion *)0x1;
    break;
  case FIXED:
    buffer_00.length_ = vector.length_;
    buffer_00.start_ = vector.start_;
    buffer_00._12_4_ = 0;
    bVar1 = FastFixedDtoa(v_00,requested_digits,buffer_00,length,point);
    goto LAB_0017afc1;
  case PRECISION:
    this = (double_conversion *)0x2;
    mode_00 = requested_digits;
    goto LAB_0017afb6;
  }
  mode_00 = FAST_DTOA_SHORTEST;
LAB_0017afb6:
  buffer_01.start_ = (char *)(ulong)(uint)vector.length_;
  buffer_01._8_8_ = length;
  bVar1 = FastDtoa(this,v_00,mode_00,(int)vector.start_,buffer_01,point,(int *)vector.start_);
LAB_0017afc1:
  if (bVar1 == false) {
    buffer_02.start_ = (char *)(ulong)(uint)vector.length_;
    buffer_02._8_8_ = length;
    BignumDtoa((double_conversion *)(ulong)mode,v_00,requested_digits,(int)vector.start_,buffer_02,
               point,(int *)vector.start_);
    pcVar2 = Vector<char>::operator[](&vector,*length);
    *pcVar2 = '\0';
  }
  return;
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  ASSERT(!Double(v).IsSpecial());
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
    default:
      fast_worked = false;
      UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}